

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::BinaryExpression::evalImpl(BinaryExpression *this,EvalContext *context)

{
  bool bVar1;
  Expression *pEVar2;
  EvalContext *context_00;
  BinaryExpression *in_RSI;
  ConstantValue *in_RDI;
  ConstantValue cvr;
  ConstantValue cvl;
  bool val;
  Type *rt;
  Type *lt;
  ConstantValue *in_stack_000005f8;
  ConstantValue *in_stack_00000600;
  BinaryOperator in_stack_0000060c;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  EvalContext *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef0;
  BinaryOperator BVar3;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar4;
  Type *in_stack_ffffffffffffff90;
  Type *in_stack_ffffffffffffff98;
  
  pEVar2 = left(in_RSI);
  if ((pEVar2->kind == TypeReference) && (pEVar2 = right(in_RSI), pEVar2->kind == TypeReference)) {
    pEVar2 = left(in_RSI);
    Expression::as<slang::ast::TypeReferenceExpression>(pEVar2);
    pEVar2 = right(in_RSI);
    Expression::as<slang::ast::TypeReferenceExpression>(pEVar2);
    Type::isMatching(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    SVInt::SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 CONCAT13(in_stack_fffffffffffffeef,
                          CONCAT12(in_stack_fffffffffffffeee,
                                   CONCAT11(in_stack_fffffffffffffeed,in_stack_fffffffffffffeec))),
                 (uint64_t)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffee0,
               (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    return in_RDI;
  }
  left(in_RSI);
  Expression::eval((Expression *)
                   CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,
                                     CONCAT15(in_stack_fffffffffffffeed,
                                              CONCAT14(in_stack_fffffffffffffeec,
                                                       in_stack_fffffffffffffee8)))),
                   in_stack_fffffffffffffee0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8475af);
  if (!bVar1) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffee0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    goto LAB_0084788a;
  }
  bVar1 = OpInfo::isShortCircuit(in_RSI->op);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
  if (bVar1) {
    BVar3 = in_RSI->op;
    if (BVar3 == LogicalAnd) {
      in_stack_fffffffffffffeee =
           slang::ConstantValue::isFalse((ConstantValue *)in_stack_fffffffffffffee0);
      if ((bool)in_stack_fffffffffffffeee) {
        SVInt::SVInt<bool>((SVInt *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffee0,
                   (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        SVInt::~SVInt((SVInt *)CONCAT44(uVar4,BVar3));
        goto LAB_0084788a;
      }
    }
    else if (BVar3 == LogicalOr) {
      in_stack_fffffffffffffeef =
           slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffee0);
      if ((bool)in_stack_fffffffffffffeef) {
        SVInt::SVInt<bool>((SVInt *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffee0,
                   (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        SVInt::~SVInt((SVInt *)CONCAT44(uVar4,BVar3));
        goto LAB_0084788a;
      }
    }
    else {
      in_stack_fffffffffffffeed =
           slang::ConstantValue::isFalse((ConstantValue *)in_stack_fffffffffffffee0);
      if ((bool)in_stack_fffffffffffffeed) {
        SVInt::SVInt<bool>((SVInt *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffee0,
                   (SVInt *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        SVInt::~SVInt((SVInt *)CONCAT44(uVar4,BVar3));
        goto LAB_0084788a;
      }
    }
  }
  context_00 = (EvalContext *)right(in_RSI);
  Expression::eval((Expression *)
                   CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,
                                     CONCAT15(in_stack_fffffffffffffeed,
                                              CONCAT14(in_stack_fffffffffffffeec,
                                                       in_stack_fffffffffffffee8)))),context_00);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x847807);
  if (bVar1) {
    OpInfo::eval(in_stack_0000060c,in_stack_00000600,in_stack_000005f8);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)context_00,(nullptr_t)CONCAT17(bVar1,in_stack_fffffffffffffed8));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x84788a);
LAB_0084788a:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x847897);
  return in_RDI;
}

Assistant:

ConstantValue BinaryExpression::evalImpl(EvalContext& context) const {
    if (left().kind == ExpressionKind::TypeReference &&
        right().kind == ExpressionKind::TypeReference) {
        auto& lt = left().as<TypeReferenceExpression>().targetType;
        auto& rt = right().as<TypeReferenceExpression>().targetType;
        bool val = lt.isMatching(rt);
        if (op == BinaryOperator::Inequality || op == BinaryOperator::CaseInequality)
            val = !val;

        return SVInt(1, val, false);
    }

    ConstantValue cvl = left().eval(context);
    if (!cvl)
        return nullptr;

    // Handle short-circuiting operators up front, as we need to avoid
    // evaluating the rhs entirely in those cases.
    if (OpInfo::isShortCircuit(op)) {
        switch (op) {
            case BinaryOperator::LogicalOr:
                if (cvl.isTrue())
                    return SVInt(true);
                break;
            case BinaryOperator::LogicalAnd:
                if (cvl.isFalse())
                    return SVInt(false);
                break;
            case BinaryOperator::LogicalImplication:
                if (cvl.isFalse())
                    return SVInt(true);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    ConstantValue cvr = right().eval(context);
    if (!cvr)
        return nullptr;

    return OpInfo::eval(op, cvl, cvr);
}